

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardImpl.cpp
# Opt level: O3

Key sf::priv::KeyboardImpl::getKeyFromEvent(XKeyEvent *event)

{
  KeySym symbol;
  Key KVar1;
  int iVar2;
  bool bVar3;
  
  iVar2 = 0;
  do {
    symbol = XLookupKeysym(event,iVar2);
    KVar1 = keySymToKey(symbol);
    if (KVar1 != Unknown) {
      return KVar1;
    }
    bVar3 = iVar2 != 3;
    iVar2 = iVar2 + 1;
  } while (bVar3);
  return Unknown;
}

Assistant:

Keyboard::Key KeyboardImpl::getKeyFromEvent(XKeyEvent& event)
{
    // Try each KeySym index (modifier group) until we get a match
    for (int i = 0; i < 4; ++i)
    {
        // Get the SFML keyboard code from the keysym of the key that has been pressed
        KeySym keysym = XLookupKeysym(&event, i);
        Keyboard::Key key = keySymToKey(keysym);
        if (key != Keyboard::Unknown)
            return key;
    }

    return Keyboard::Unknown;
}